

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

char * skipDollarQuotedString(char *zSql,char *delimiterStart,idx_t delimiterLength)

{
  int iVar1;
  char *pcVar2;
  idx_t iVar3;
  
  pcVar2 = zSql + 1;
  do {
    if (*zSql == '$') {
      iVar3 = 0;
      while( true ) {
        if (pcVar2[iVar3] == '\0') {
          return (char *)0x0;
        }
        if (pcVar2[iVar3] == '$') break;
        iVar3 = iVar3 + 1;
      }
      if ((delimiterLength == iVar3) &&
         (iVar1 = bcmp(zSql + 1,delimiterStart,delimiterLength), iVar1 == 0)) {
        return pcVar2 + iVar3;
      }
    }
    else if (*zSql == '\0') {
      return (char *)0x0;
    }
    zSql = zSql + 1;
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

const char *skipDollarQuotedString(const char *zSql, const char *delimiterStart, idx_t delimiterLength) {
	for (; *zSql; zSql++) {
		if (*zSql == '$') {
			// found a dollar
			// move forward and find the next dollar
			zSql++;
			auto start = zSql;
			while (*zSql && *zSql != '$') {
				zSql++;
			}
			if (!zSql[0]) {
				// reached end of string while looking for the dollar
				return nullptr;
			}
			// check if the dollar quoted string name matches
			if (delimiterLength == idx_t(zSql - start)) {
				if (memcmp(start, delimiterStart, delimiterLength) == 0) {
					return zSql;
				}
			}
			// dollar does not match - reset position to start and keep looking
			zSql = start - 1;
		}
	}
	// unterminated
	return nullptr;
}